

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCBufferedWriter.cpp
# Opt level: O3

int32_t __thiscall gnilk::IPCBufferedWriter::Flush(IPCBufferedWriter *this)

{
  pointer puVar1;
  int iVar2;
  
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (**this->writer->_vptr_IPCWriter)
                    (this->writer,puVar1,
                     (long)(this->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar1);
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return iVar2;
}

Assistant:

int32_t IPCBufferedWriter::Flush() {
    auto res = writer.Write(data.data(), data.size());
    data.clear();
    return res;
}